

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O2

int ARKodeSetRelaxSolver(void *arkode_mem,ARKRelaxSolver solver)

{
  int error_code;
  int line;
  char *msgfmt;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  
  error_code = arkRelaxAccessMem(arkode_mem,"ARKodeSetRelaxSolver",&ark_mem,&relax_mem);
  if (error_code == 0) {
    if (ark_mem->step_supports_relaxation == 0) {
      msgfmt = "time-stepping module does not support relaxation";
      error_code = -0x30;
      line = 0x221;
    }
    else {
      if (solver < 2) {
        relax_mem->solver = solver;
        return 0;
      }
      msgfmt = "An invalid relaxation solver option was provided.";
      error_code = -0x16;
      line = 0x228;
    }
    arkProcessError(ark_mem,error_code,line,"ARKodeSetRelaxSolver",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,msgfmt);
  }
  return error_code;
}

Assistant:

int ARKodeSetRelaxSolver(void* arkode_mem, ARKRelaxSolver solver)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (solver != ARK_RELAX_BRENT && solver != ARK_RELAX_NEWTON)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "An invalid relaxation solver option was provided.");
    return ARK_ILL_INPUT;
  }

  relax_mem->solver = solver;

  return ARK_SUCCESS;
}